

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O2

MPP_RET hal_h265e_v510_start(void *hal,HalEncTask *enc_task)

{
  void *pvVar1;
  void *pvVar2;
  MPP_RET MVar3;
  char *fname;
  char *fmt;
  int level;
  ulong uVar4;
  MppDevRegWrCfg cfg;
  MppDevRegRdCfg cfg1;
  
  pvVar1 = *(void **)(*(long *)((long)hal + 0x90) + 0x18);
  pvVar2 = *(void **)(*(long *)((long)hal + 0x90) + 0x20);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x839);
  }
  if ((enc_task->flags).err != 0) {
    _mpp_log_l(2,"hal_h265e_v510","enc_task->flags.err %08x, return e arly","hal_h265e_v510_start");
    return MPP_NOK;
  }
  cfg.size = 0x60;
  cfg.offset = 0;
  cfg.reg = pvVar1;
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg);
  if (MVar3 == MPP_OK) {
    if (((byte)hal_h265e_debug & 0x20) != 0) {
      for (uVar4 = 0; uVar4 != 0x60; uVar4 = uVar4 + 4) {
        if (((byte)hal_h265e_debug & 0x20) != 0) {
          _mpp_log_l(4,"hal_h265e_v510","ctl reg[%04x]: 0%08x\n",(char *)0x0,uVar4 & 0xffffffff,
                     (ulong)*(uint *)((long)pvVar1 + uVar4));
        }
      }
    }
    cfg.size = 0x188;
    cfg.offset = 0x270;
    cfg.reg = (void *)((long)pvVar1 + 0x60);
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg);
    if (MVar3 != MPP_OK) goto LAB_0024ea49;
    if (((byte)hal_h265e_debug & 0x10) != 0) {
      for (uVar4 = 0; uVar4 != 0x80; uVar4 = uVar4 + 4) {
        if (((byte)hal_h265e_debug & 0x10) != 0) {
          _mpp_log_l(4,"hal_h265e_v510","hw add cfg reg[%04x]: 0%08x\n",(char *)0x0,
                     uVar4 & 0xffffffff,(ulong)*(uint *)((long)pvVar1 + 0x60 + uVar4));
        }
      }
      for (uVar4 = 0; uVar4 != 0x108; uVar4 = uVar4 + 4) {
        if (((byte)hal_h265e_debug & 0x10) != 0) {
          _mpp_log_l(4,"hal_h265e_v510","set reg[%04x]: 0%08x\n",(char *)0x0,uVar4 & 0xffffffff,
                     (ulong)*(uint *)((long)pvVar1 + uVar4 + 0xe0));
        }
      }
    }
    cfg.size = 0x110;
    cfg.offset = 0x1000;
    cfg.reg = (void *)((long)pvVar1 + 0x1e8);
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg);
    if (MVar3 != MPP_OK) goto LAB_0024ea49;
    if (((byte)hal_h265e_debug & 0x40) != 0) {
      for (uVar4 = 0; uVar4 != 0x110; uVar4 = uVar4 + 4) {
        if (((byte)hal_h265e_debug & 0x40) != 0) {
          _mpp_log_l(4,"hal_h265e_v510","set reg[%04x]: 0%08x\n",(char *)0x0,uVar4 & 0xffffffff,
                     (ulong)*(uint *)((long)pvVar1 + 0x1e8 + uVar4));
        }
      }
    }
    cfg.size = 0x2d0;
    cfg.offset = 0x1700;
    cfg.reg = (void *)((long)pvVar1 + 0x2f8);
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg);
    if (MVar3 != MPP_OK) goto LAB_0024ea49;
    if (((byte)hal_h265e_debug & 0x80) != 0) {
      for (uVar4 = 0; uVar4 != 0x2d0; uVar4 = uVar4 + 4) {
        if (((byte)hal_h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"hal_h265e_v510","set reg[%04x]: 0%08x\n",(char *)0x0,uVar4 & 0xffffffff,
                     (ulong)*(uint *)((long)pvVar1 + 0x2f8 + uVar4));
        }
      }
    }
    cfg.reg = (void *)((long)pvVar1 + 0x5c8);
    cfg.size = 0x130;
    cfg.offset = 0x2000;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg);
    if (MVar3 != MPP_OK) goto LAB_0024ea49;
    cfg.reg = (void *)((long)pvVar1 + 0x6f8);
    cfg.size = 0x388;
    cfg.offset = 0x2200;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg);
    if (MVar3 != MPP_OK) goto LAB_0024ea49;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),7,*(void **)((long)hal + 0x398));
    if (MVar3 == MPP_OK) {
      cfg1.size = 4;
      cfg1.offset = 0x2c;
      cfg1.reg = pvVar2;
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,&cfg1);
      if (MVar3 == MPP_OK) {
        cfg1.reg = (void *)((long)pvVar2 + 4);
        cfg1.size = 0x250;
        cfg1.offset = 0x4000;
        MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,&cfg1);
        if (MVar3 == MPP_OK) {
          MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
          if (MVar3 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v510","send cmd failed %d\n","hal_h265e_v510_start",
                       (ulong)(uint)MVar3);
          }
          if (((byte)hal_h265e_debug & 4) == 0) {
            return MVar3;
          }
          fmt = "(%d) leave\n";
          level = 4;
          fname = (char *)0x0;
          uVar4 = 0x8b9;
          goto LAB_0024ea66;
        }
      }
      uVar4 = (ulong)(uint)MVar3;
      fmt = "set register read failed %d\n";
    }
    else {
      uVar4 = (ulong)(uint)MVar3;
      fmt = "set register offsets failed %d\n";
    }
  }
  else {
LAB_0024ea49:
    uVar4 = (ulong)(uint)MVar3;
    fmt = "set register write failed %d\n";
  }
  MVar3 = (MPP_RET)uVar4;
  fname = "hal_h265e_v510_start";
  level = 2;
LAB_0024ea66:
  _mpp_log_l(level,"hal_h265e_v510",fmt,fname,uVar4);
  return MVar3;
}

Assistant:

MPP_RET hal_h265e_v510_start(void *hal, HalEncTask *enc_task)
{
    MPP_RET ret = MPP_OK;
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    Vepu510H265eFrmCfg *frm = ctx->frm;
    RK_U32 *regs = (RK_U32*)frm->regs_set;
    H265eV510RegSet *hw_regs = frm->regs_set;
    H265eV510StatusElem *reg_out = (H265eV510StatusElem *)frm->regs_ret;
    MppDevRegWrCfg cfg;
    MppDevRegRdCfg cfg1;
    RK_U32 i = 0;

    hal_h265e_enter();
    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return e arly",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    cfg.reg = (RK_U32*)&hw_regs->reg_ctl;
    cfg.size = sizeof(Vepu510ControlCfg);
    cfg.offset = VEPU510_CTL_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    if (hal_h265e_debug & HAL_H265E_DBG_CTL_REGS) {
        regs = (RK_U32*)&hw_regs->reg_ctl;
        for (i = 0; i < sizeof(Vepu510ControlCfg) / 4; i++) {
            hal_h265e_dbg_ctl("ctl reg[%04x]: 0%08x\n", i * 4, regs[i]);
        }
    }

    cfg.reg = &hw_regs->reg_frm;
    cfg.size = sizeof(H265eVepu510Frame);
    cfg.offset = VEPU510_FRAME_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    if (hal_h265e_debug & HAL_H265E_DBG_REGS) {
        regs = (RK_U32*)(&hw_regs->reg_frm);
        for (i = 0; i < 32; i++) {
            hal_h265e_dbg_regs("hw add cfg reg[%04x]: 0%08x\n", i * 4, regs[i]);
        }
        regs += 32;
        for (i = 0; i < (sizeof(H265eVepu510Frame) - 128) / 4; i++) {
            hal_h265e_dbg_regs("set reg[%04x]: 0%08x\n", i * 4, regs[i]);
        }
    }
    cfg.reg = &hw_regs->reg_rc_roi;
    cfg.size = sizeof(Vepu510RcRoi);
    cfg.offset = VEPU510_RC_ROI_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    if (hal_h265e_debug & HAL_H265E_DBG_RCKUT_REGS) {
        regs = (RK_U32*)&hw_regs->reg_rc_roi;
        for (i = 0; i < sizeof(Vepu510RcRoi) / 4; i++) {
            hal_h265e_dbg_rckut("set reg[%04x]: 0%08x\n", i * 4, regs[i]);
        }
    }

    cfg.reg =  &hw_regs->reg_param;
    cfg.size = sizeof(H265eVepu510Param);
    cfg.offset = VEPU510_PARAM_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    if (hal_h265e_debug & HAL_H265E_DBG_WGT_REGS) {
        regs = (RK_U32*)&hw_regs->reg_param;
        for (i = 0; i < sizeof(H265eVepu510Param) / 4; i++) {
            hal_h265e_dbg_wgt("set reg[%04x]: 0%08x\n", i * 4, regs[i]);
        }
    }

    cfg.reg = &hw_regs->reg_sqi;
    cfg.size = sizeof(H265eVepu510Sqi);
    cfg.offset = VEPU510_SQI_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg.reg = &hw_regs->reg_scl;
    cfg.size = sizeof(hw_regs->reg_scl);
    cfg.offset = VEPU510_SCL_OFFSET ;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, ctx->reg_cfg);
    if (ret) {
        mpp_err_f("set register offsets failed %d\n", ret);
        return ret;
    }

    cfg1.reg = &reg_out->hw_status;
    cfg1.size = sizeof(RK_U32);
    cfg1.offset = VEPU510_REG_BASE_HW_STATUS;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
    if (ret) {
        mpp_err_f("set register read failed %d\n", ret);
        return ret;
    }

    cfg1.reg = &reg_out->st;
    cfg1.size = sizeof(H265eV510StatusElem) - 4;
    cfg1.offset = VEPU510_STATUS_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
    if (ret) {
        mpp_err_f("set register read failed %d\n", ret);
        return ret;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_h265e_leave();
    return ret;
}